

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O3

ssize_t __thiscall
TadsServerThread::read(TadsServerThread *this,int __fd,void *__buf,size_t __nbytes)

{
  OS_Socket *pOVar1;
  OS_Event *pOVar2;
  undefined1 *puVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  ssize_t sVar8;
  ulong uVar9;
  undefined1 *__n;
  undefined4 in_register_00000034;
  long lVar10;
  int in_R8D;
  undefined4 in_register_00000084;
  unsigned_long timeout;
  void *__buf_00;
  long lVar11;
  void *pvVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char ibuf [4096];
  undefined1 local_1058 [16];
  OS_Waitable *local_1048;
  undefined1 local_1038 [4104];
  
  lVar10 = CONCAT44(in_register_00000034,__fd);
  timeout = CONCAT44(in_register_00000084,in_R8D);
  lVar5 = os_get_sys_clock_ms();
  uVar6 = lVar5 + timeout;
  pvVar12 = __buf;
  if ((long)__nbytes < (long)__buf) {
    pvVar12 = (void *)__nbytes;
  }
  if (lVar10 == 0) {
    pvVar12 = (void *)__nbytes;
  }
  lVar5 = 0;
  do {
    while( true ) {
      pvVar7 = (void *)0x1000;
      if (pvVar12 < (void *)0x1000) {
        pvVar7 = pvVar12;
      }
      __n = local_1038;
      __buf_00 = (void *)((long)__buf - lVar5);
      puVar3 = (undefined1 *)(lVar10 + lVar5);
      if (lVar10 == 0) {
        __buf_00 = pvVar7;
        puVar3 = __n;
      }
      set_run_state(this,"Receiving");
      sVar8 = OS_Socket::recv(this->socket,(int)puVar3,__buf_00,(size_t)__n,in_R8D);
      iVar4 = (int)sVar8;
      if (iVar4 == -1) break;
      if (iVar4 == 0) {
        set_run_state(this,"Error(receiving)");
        return -1;
      }
      lVar11 = (long)iVar4;
      if ((void *)((long)pvVar12 - lVar11) == (void *)0x0 || (long)pvVar12 < lVar11) {
        set_run_state(this,"Receive completed");
        return lVar5 + lVar11;
      }
      lVar5 = lVar5 + lVar11;
      pvVar12 = (void *)((long)pvVar12 - lVar11);
    }
    if ((this->socket->super_OS_CoreSocket).err != 0xb) {
      return -1;
    }
    bVar13 = timeout != 0xffffffffffffffff;
    timeout = 0xffffffffffffffff;
    if (bVar13) {
      uVar9 = os_get_sys_clock_ms();
      timeout = uVar6 - uVar9;
      if (uVar6 < uVar9) {
        return -1;
      }
    }
    set_run_state(this,"Waiting(receive)");
    pOVar1 = this->socket;
    pOVar2 = this->listener->quit_evt;
    local_1058._0_8_ = &(pOVar1->super_OS_CoreSocket).super_OS_Waitable;
    local_1058._8_8_ = &pOVar2->super_OS_Waitable;
    auVar14._0_4_ = -(uint)((int)pOVar1 == 0);
    auVar14._4_4_ = -(uint)((int)((ulong)pOVar1 >> 0x20) == 0);
    auVar14._8_4_ = -(uint)((int)pOVar2 == 0);
    auVar14._12_4_ = -(uint)((int)((ulong)pOVar2 >> 0x20) == 0);
    auVar15._4_4_ = auVar14._0_4_;
    auVar15._0_4_ = auVar14._4_4_;
    auVar15._8_4_ = auVar14._12_4_;
    auVar15._12_4_ = auVar14._8_4_;
    local_1058 = ~(auVar15 & auVar14) & local_1058;
    pOVar2 = this->listener->shutdown_evt;
    local_1048 = &pOVar2->super_OS_Waitable;
    if (pOVar2 == (OS_Event *)0x0) {
      local_1048 = (OS_Waitable *)0x0;
    }
    iVar4 = OS_Waitable::multi_wait(3,(OS_Waitable **)local_1058,timeout);
  } while (iVar4 == 0);
  return -1;
}

Assistant:

long TadsServerThread::read(char *buf, size_t buflen, long minlen,
                            unsigned long timeout)
{
    /* figure the ending time for the wait */
    unsigned long t = os_get_sys_clock_ms(), t_end = t + timeout;

    /* we haven't read any bytes yet */
    long totlen = 0;

    /* if the caller provided a buffer, we can't read past the buffer */
    if (buf != 0 && minlen > (long)buflen)
        minlen = buflen;
    
    /* keep going until we read some data */
    for (;;)
    {
        int len;
        char ibuf[4096], *dst;
        size_t dstlen;

        /* figure the buffer destination and size to read on this round */
        if (buf == 0)
        {
            /* 
             *   There's no buffer, so read into our internal buffer.  Tead
             *   up to the remaining minimum size, or to our available
             *   internal space, whichever is less.  
             */
            dst = ibuf;
            dstlen = (minlen < sizeof(ibuf) ? minlen : sizeof(ibuf));
        }
        else
        {
            /* 
             *   Read into the caller's buffer, after any data we've read so
             *   far, up to the remaining buffer length. 
             */
            dst = buf + totlen;
            dstlen = buflen - totlen;
        }

        /* read the data */
        set_run_state("Receiving");
        len = socket->recv(dst, dstlen);

        /* if an error occurred, check what happened */
        if (len == OS_SOCKET_ERROR)
        {
            /* presume failure */
            int ok = FALSE;
            
            /* if this is a would-block error, wait for data to arrive */
            if (socket->last_error() == OS_EWOULDBLOCK)
            {
                /* 
                 *   No data available - wait until we receive at least one
                 *   byte, or until the 'quit' event is signaled or a timeout
                 *   occurs.  Figure the next timeout expiration, if we have
                 *   a timeout at all.  
                 */
                if (timeout != OS_FOREVER)
                {
                    /* if we're already past the timeout expiration, fail */
                    t = os_get_sys_clock_ms();
                    if (t > t_end)
                        return -1;

                    /* figure the remaining timeout interval */
                    timeout = t_end - t;
                }

                /* wait */
                set_run_state("Waiting(receive)");
                OS_Waitable *w[] = {
                    socket, listener->quit_evt, listener->shutdown_evt
                };
                if (OS_Waitable::multi_wait(3, w, timeout) == OSWAIT_EVENT + 0)
                {
                    /* the socket is now ready - reset it and keep going */
                    socket->reset_event();
                    ok = TRUE;
                }
            }

            /* if we didn't correct the error, give up */
            if (!ok)
                return -1;
        }
        else if (len == 0)
        {
            /* the socket has been closed - return failure */
            set_run_state("Error(receiving)");
            return -1;
        }
        else if (len >= minlen)
        {
            /* we've satisfied the request - return the bytes */
            set_run_state("Receive completed");
            return totlen + len;
        }
        else
        {
            /* 
             *   We've read some data, but not enough to satisfy the minimum
             *   length request.  Add the current chunk to the total read so
             *   far, and deduct it from the remaining minimum.  
             */
            totlen += len;
            minlen -= len;
        }
    }
}